

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

void __thiscall CTcCodeStream::release_labels(CTcCodeStream *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long in_RDI;
  CTcLabelFixup *fixup;
  CTcCodeLabel *lbl;
  int err_cnt;
  uint local_c;
  
  local_c = 0;
  while (*(long *)(in_RDI + 0x68) != 0) {
    puVar1 = *(undefined8 **)(in_RDI + 0x68);
    *(undefined8 *)(in_RDI + 0x68) = **(undefined8 **)(in_RDI + 0x68);
    *puVar1 = *(undefined8 *)(in_RDI + 0x70);
    *(undefined8 **)(in_RDI + 0x70) = puVar1;
    while (puVar1[2] != 0) {
      puVar2 = (undefined8 *)puVar1[2];
      puVar1[2] = *(undefined8 *)puVar1[2];
      *puVar2 = *(undefined8 *)(in_RDI + 0x78);
      *(undefined8 **)(in_RDI + 0x78) = puVar2;
      local_c = local_c + 1;
    }
  }
  if (local_c != 0) {
    CTcMain::log_error(G_tcmain,(CTcTokFileDesc *)0x0,0,TC_SEV_INTERNAL,0x2ced,(ulong)local_c);
  }
  return;
}

Assistant:

void CTcCodeStream::release_labels()
{
    int err_cnt;

    /* we haven't found any errors yet */
    err_cnt = 0;
    
    /* run through the list of active labels */
    while (active_lbl_ != 0)
    {
        CTcCodeLabel *lbl;

        /* pull this label off of the active list */
        lbl = active_lbl_;
        active_lbl_ = active_lbl_->nxt;

        /* put this label on the free list */
        lbl->nxt = free_lbl_;
        free_lbl_ = lbl;

        /* check for unresolved fixups */
        while (lbl->fhead != 0)
        {
            CTcLabelFixup *fixup;
            
            /* pull this fixup off of the active list */
            fixup = lbl->fhead;
            lbl->fhead = lbl->fhead->nxt;

            /* put this fixup on the free list */
            fixup->nxt = free_fixup_;
            free_fixup_ = fixup;
            
            /* count the unresolved label */
            ++err_cnt;
        }
    }

    /* 
     *   if we found any unresolved fixups, log the error; there's not
     *   much point in logging each error individually, since this is an
     *   internal compiler error that the user can't do anything about,
     *   but at least give the user a count for compiler diagnostic
     *   purposes 
     */
    if (err_cnt != 0)
        G_tcmain->log_error(0, 0, TC_SEV_INTERNAL,
                          TCERR_UNRES_TMP_FIXUP, err_cnt);
}